

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<float> __thiscall
vkt::shaderexecutor::Functions::Length<3>::doExpand
          (Length<3> *this,ExpandContext *param_1,ArgExprs *args)

{
  ExprP<tcu::Vector<float,_3>_> *in_RCX;
  SharedPtrStateBase *extraout_RDX;
  double __x;
  ExprP<float> EVar1;
  ExprP<float> local_38;
  ArgExprs *args_local;
  ExpandContext *param_1_local;
  Length<3> *this_local;
  
  args_local = args;
  param_1_local = param_1;
  this_local = this;
  dot<3>((Functions *)&local_38,in_RCX,in_RCX);
  sqrt((Functions *)this,__x);
  ExprP<float>::~ExprP(&local_38);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state =
       extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr =
       (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>;
}

Assistant:

ExprP<float>	doExpand	(ExpandContext&, const ArgExprs& args) const
	{
		return sqrt(dot(args.a, args.a));
	}